

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmul_template.h
# Opt level: O2

u32 crc32_x86_vpclmulqdq_avx512_vl512(u32 crc,u8 *p,size_t len)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  size_t i;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [64];
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar21 [16];
  
  auVar31 = ZEXT416(crc);
  if (len < 0x200) {
    if (len < 0x40) {
      if (len < 0x10) {
        if (len < 4) {
          for (sVar15 = 0; len != sVar15; sVar15 = sVar15 + 1) {
            crc = crc >> 8 ^ crc32_slice1_table[(uint)p[sVar15] ^ crc & 0xff];
          }
          return crc;
        }
        uVar14 = ~(-1 << ((byte)len & 0x1f));
        auVar20 = vmovdqu8_avx512vl(*(undefined1 (*) [16])p);
        auVar21[1] = ((byte)(uVar14 >> 1) & 1) * auVar20[1];
        auVar21[0] = ((byte)uVar14 & 1) * auVar20[0];
        auVar21[2] = ((byte)(uVar14 >> 2) & 1) * auVar20[2];
        auVar21[3] = ((byte)(uVar14 >> 3) & 1) * auVar20[3];
        auVar21[4] = ((byte)(uVar14 >> 4) & 1) * auVar20[4];
        auVar21[5] = ((byte)(uVar14 >> 5) & 1) * auVar20[5];
        auVar21[6] = ((byte)(uVar14 >> 6) & 1) * auVar20[6];
        auVar21[7] = ((byte)(uVar14 >> 7) & 1) * auVar20[7];
        auVar21[8] = ((byte)(uVar14 >> 8) & 1) * auVar20[8];
        auVar21[9] = ((byte)(uVar14 >> 9) & 1) * auVar20[9];
        auVar21[10] = ((byte)(uVar14 >> 10) & 1) * auVar20[10];
        auVar21[0xb] = ((byte)(uVar14 >> 0xb) & 1) * auVar20[0xb];
        auVar21[0xc] = ((byte)(uVar14 >> 0xc) & 1) * auVar20[0xc];
        auVar21[0xd] = ((byte)(uVar14 >> 0xd) & 1) * auVar20[0xd];
        auVar21[0xe] = ((byte)(uVar14 >> 0xe) & 1) * auVar20[0xe];
        auVar21[0xf] = ((byte)(uVar14 >> 0xf) & 1) * auVar20[0xf];
        auVar31 = vpshufb_avx(auVar21 ^ auVar31,*(undefined1 (*) [16])(shift_tab + len));
      }
      else {
        auVar31 = auVar31 ^ *(undefined1 (*) [16])p;
        if (0x1f < len) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = auVar31._0_8_;
          auVar21 = (undefined1  [16])0x0;
          for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
            if ((auVar3 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
              auVar21 = auVar21 ^ ZEXT816(0xae689191) << uVar14;
            }
          }
          auVar10._8_8_ = 0;
          auVar10._0_8_ = auVar31._8_8_;
          auVar31 = (undefined1  [16])0x0;
          for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
            if ((auVar10 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
              auVar31 = auVar31 ^ ZEXT816(0xccaa009e) << uVar14;
            }
          }
          auVar31 = vpternlogq_avx512vl(auVar31,auVar21,*(undefined1 (*) [16])(p + 0x10),0x96);
          if (0x2f < len) {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = auVar31._0_8_;
            auVar21 = (undefined1  [16])0x0;
            for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
              if ((auVar4 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
                auVar21 = auVar21 ^ ZEXT816(0xae689191) << uVar14;
              }
            }
            auVar11._8_8_ = 0;
            auVar11._0_8_ = auVar31._8_8_;
            auVar31 = (undefined1  [16])0x0;
            for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
              if ((auVar11 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
                auVar31 = auVar31 ^ ZEXT816(0xccaa009e) << uVar14;
              }
            }
            auVar31 = vpternlogq_avx512vl(auVar31,auVar21,*(undefined1 (*) [16])(p + 0x20),0x96);
          }
        }
        uVar17 = len & 0xf;
        if (uVar17 != 0) {
          auVar21 = vpshufb_avx(auVar31,*(undefined1 (*) [16])(shift_tab + uVar17));
          auVar31 = vpshufb_avx(auVar31,*(undefined1 (*) [16])(shift_tab + uVar17 + 0x10));
          auVar31 = vpblendvb_avx(auVar31,*(undefined1 (*) [16])
                                           (p + uVar17 + ((ulong)((uint)len & 0x30) - 0x10)),
                                  *(undefined1 (*) [16])(shift_tab + uVar17 + 0x10));
          auVar5._8_8_ = 0;
          auVar5._0_8_ = auVar21._0_8_;
          auVar20 = (undefined1  [16])0x0;
          for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
            if ((auVar5 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
              auVar20 = auVar20 ^ ZEXT816(0xae689191) << uVar14;
            }
          }
          auVar13._8_8_ = 0;
          auVar13._0_8_ = auVar21._8_8_;
          auVar21 = (undefined1  [16])0x0;
          for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
            if ((auVar13 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
              auVar21 = auVar21 ^ ZEXT816(0xccaa009e) << uVar14;
            }
          }
          auVar31 = vpternlogq_avx512vl(auVar21,auVar20,auVar31,0x96);
        }
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar31._0_8_;
      auVar21 = (undefined1  [16])0x0;
      for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
        if ((auVar7 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
          auVar21 = auVar21 ^ ZEXT816(0xccaa009e) << uVar14;
        }
      }
      auVar31 = vpsrldq_avx(auVar31,8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = SUB168(auVar21 ^ auVar31,0);
      auVar31 = (undefined1  [16])0x0;
      for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
        if ((auVar6 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
          auVar31 = auVar31 ^ ZEXT816(0xb4e5b025f7011641) << uVar14;
        }
      }
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auVar31._0_8_;
      auVar31 = (undefined1  [16])0x0;
      for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
        if ((auVar8 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
          auVar31 = auVar31 ^ ZEXT816(0x1db710641) << uVar14;
        }
      }
      return auVar21._8_4_ ^ auVar31._8_4_;
    }
    auVar22 = vpxorq_avx512f(ZEXT1664(auVar31),*(undefined1 (*) [64])p);
    if (len < 0x80) goto LAB_0010af91;
    auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])(p + 0x40));
    if (0xff < len) {
      auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(p + 0x80));
      auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])(p + 0xc0));
      goto LAB_0010aed2;
    }
LAB_0010af46:
    p = (u8 *)((long)p + 0x80);
  }
  else {
    if ((len < 0x10001) || (((ulong)p & 0x3f) == 0)) {
      auVar24 = vpxorq_avx512f(ZEXT1664(auVar31),*(undefined1 (*) [64])p);
    }
    else {
      uVar14 = (uint)-(long)p;
      uVar16 = (ulong)(uVar14 & 0x3f);
      auVar31 = auVar31 ^ *(undefined1 (*) [16])p;
      uVar19 = -(long)p & 0xf;
      uVar17 = uVar16;
      if (uVar19 != 0) {
        auVar21 = vpshufb_avx(auVar31,*(undefined1 (*) [16])(shift_tab + uVar19));
        auVar31 = vpshufb_avx(auVar31,*(undefined1 (*) [16])(shift_tab + uVar19 + 0x10));
        auVar31 = vpblendvb_avx(auVar31,*(undefined1 (*) [16])(p + uVar19),
                                *(undefined1 (*) [16])(shift_tab + uVar19 + 0x10));
        auVar2._8_8_ = 0;
        auVar2._0_8_ = auVar21._0_8_;
        auVar20 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar2 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar20 = auVar20 ^ ZEXT816(0xae689191) << uVar1;
          }
        }
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar21._8_8_;
        auVar21 = (undefined1  [16])0x0;
        for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
          if ((auVar9 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
            auVar21 = auVar21 ^ ZEXT816(0xccaa009e) << uVar1;
          }
        }
        auVar31 = vpternlogq_avx512vl(auVar21,auVar20,auVar31,0x96);
        uVar17 = (ulong)(uVar14 & 0x30);
      }
      len = len - uVar16;
      p = p + uVar19;
      for (; uVar17 != 0; uVar17 = uVar17 - 0x10) {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = auVar31._0_8_;
        auVar21 = (undefined1  [16])0x0;
        for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
          if ((auVar20 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
            auVar21 = auVar21 ^ ZEXT816(0xae689191) << uVar14;
          }
        }
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auVar31._8_8_;
        auVar31 = (undefined1  [16])0x0;
        for (uVar14 = 0; uVar14 < 0x40; uVar14 = uVar14 + 1) {
          if ((auVar12 & (undefined1  [16])0x1 << uVar14) != (undefined1  [16])0x0) {
            auVar31 = auVar31 ^ ZEXT816(0xccaa009e) << uVar14;
          }
        }
        auVar31 = vpternlogq_avx512vl(auVar31,auVar21,
                                      *(undefined1 (*) [16])(*(undefined1 (*) [64])p + 0x10),0x96);
        p = *(undefined1 (*) [64])p + 0x10;
      }
      auVar24 = vinserti32x4_avx512f
                          (ZEXT1664(auVar31),*(undefined1 (*) [16])(*(undefined1 (*) [64])p + 8),1);
      auVar24 = vinserti64x4_avx512f
                          (auVar24,*(undefined1 (*) [32])(*(undefined1 (*) [64])p + 0x10),1);
    }
    auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x40));
    auVar29 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x80));
    auVar30 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0xc0));
    auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x100));
    auVar32 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x140));
    auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x180));
    auVar26 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)p + 0x1c0));
    auVar27 = vpbroadcastq_avx512f(ZEXT816(0x1072db28));
    auVar28 = vpbroadcastq_avx512f(ZEXT816(0xc30f51d));
    pauVar18 = (undefined1 (*) [64])p;
    for (; p = (u8 *)(pauVar18 + 8), 0x3ff < len; len = len - 0x200) {
      auVar22 = vpclmulqdq_vpclmulqdq(auVar24,auVar27,0);
      auVar24 = vpclmulqdq_vpclmulqdq(auVar24,auVar28,0x11);
      auVar24 = vpternlogd_avx512f(auVar24,auVar22,*(undefined1 (*) [64])p,0x96);
      auVar22 = vpclmulqdq_vpclmulqdq(auVar25,auVar27,0);
      auVar25 = vpclmulqdq_vpclmulqdq(auVar25,auVar28,0x11);
      auVar25 = vpternlogd_avx512f(auVar25,auVar22,pauVar18[9],0x96);
      auVar22 = vpclmulqdq_vpclmulqdq(auVar29,auVar27,0);
      auVar29 = vpclmulqdq_vpclmulqdq(auVar29,auVar28,0x11);
      auVar29 = vpternlogd_avx512f(auVar29,auVar22,pauVar18[10],0x96);
      auVar22 = vpclmulqdq_vpclmulqdq(auVar30,auVar27,0);
      auVar30 = vpclmulqdq_vpclmulqdq(auVar30,auVar28,0x11);
      auVar30 = vpternlogd_avx512f(auVar30,auVar22,pauVar18[0xb],0x96);
      auVar22 = vpclmulqdq_vpclmulqdq(auVar23,auVar27,0);
      auVar23 = vpclmulqdq_vpclmulqdq(auVar23,auVar28,0x11);
      auVar23 = vpternlogd_avx512f(auVar23,auVar22,pauVar18[0xc],0x96);
      auVar22 = vpclmulqdq_vpclmulqdq(auVar32,auVar27,0);
      auVar32 = vpclmulqdq_vpclmulqdq(auVar32,auVar28,0x11);
      auVar32 = vpternlogd_avx512f(auVar32,auVar22,pauVar18[0xd],0x96);
      auVar22 = vpclmulqdq_vpclmulqdq(auVar33,auVar27,0);
      auVar33 = vpclmulqdq_vpclmulqdq(auVar33,auVar28,0x11);
      auVar33 = vpternlogd_avx512f(auVar33,auVar22,pauVar18[0xe],0x96);
      auVar22 = vpclmulqdq_vpclmulqdq(auVar26,auVar27,0);
      auVar26 = vpclmulqdq_vpclmulqdq(auVar26,auVar28,0x11);
      auVar26 = vpternlogd_avx512f(auVar26,auVar22,pauVar18[0xf],0x96);
      pauVar18 = (undefined1 (*) [64])p;
    }
    auVar27 = vpbroadcastq_avx512f(ZEXT816(0xce3371cb));
    auVar22 = vpclmulqdq_vpclmulqdq(auVar24,auVar27,0);
    auVar28 = vpbroadcastq_avx512f(ZEXT816(0xe95c1271));
    auVar24 = vpclmulqdq_vpclmulqdq(auVar24,auVar28,0x11);
    auVar22 = vpternlogd_avx512f(auVar24,auVar22,auVar23,0x96);
    auVar23 = vpclmulqdq_vpclmulqdq(auVar25,auVar27,0);
    auVar24 = vpclmulqdq_vpclmulqdq(auVar25,auVar28,0x11);
    auVar23 = vpternlogd_avx512f(auVar24,auVar23,auVar32,0x96);
    auVar25 = vpclmulqdq_vpclmulqdq(auVar29,auVar27,0);
    auVar24 = vpclmulqdq_vpclmulqdq(auVar29,auVar28,0x11);
    auVar24 = vpternlogd_avx512f(auVar24,auVar25,auVar33,0x96);
    auVar29 = vpclmulqdq_vpclmulqdq(auVar30,auVar27,0);
    auVar25 = vpclmulqdq_vpclmulqdq(auVar30,auVar28,0x11);
    auVar25 = vpternlogd_avx512f(auVar25,auVar29,auVar26,0x96);
    if (((uint)len >> 8 & 1) != 0) {
      auVar30 = vpclmulqdq_vpclmulqdq(auVar22,auVar27,0);
      auVar29 = vpclmulqdq_vpclmulqdq(auVar22,auVar28,0x11);
      auVar22 = vpternlogd_avx512f(auVar29,auVar30,*(undefined1 (*) [64])p,0x96);
      auVar30 = vpclmulqdq_vpclmulqdq(auVar23,auVar27,0);
      auVar29 = vpclmulqdq_vpclmulqdq(auVar23,auVar28,0x11);
      auVar23 = vpternlogd_avx512f(auVar29,auVar30,pauVar18[9],0x96);
      auVar29 = vpclmulqdq_vpclmulqdq(auVar24,auVar27,0);
      auVar24 = vpclmulqdq_vpclmulqdq(auVar24,auVar28,0x11);
      auVar24 = vpternlogd_avx512f(auVar24,auVar29,pauVar18[10],0x96);
      auVar29 = vpclmulqdq_vpclmulqdq(auVar25,auVar27,0);
      auVar25 = vpclmulqdq_vpclmulqdq(auVar25,auVar28,0x11);
      auVar25 = vpternlogd_avx512f(auVar25,auVar29,pauVar18[0xb],0x96);
LAB_0010aed2:
      p = (u8 *)((long)p + 0x100);
    }
    auVar29 = vpbroadcastq_avx512f(ZEXT816(0x33fff533));
    auVar33 = vpclmulqdq_vpclmulqdq(auVar22,auVar29,0);
    auVar30 = vpbroadcastq_avx512f(ZEXT816(0x910eeec1));
    auVar32 = vpclmulqdq_vpclmulqdq(auVar22,auVar30,0x11);
    auVar22 = vpternlogd_avx512f(auVar32,auVar33,auVar24,0x96);
    auVar32 = vpclmulqdq_vpclmulqdq(auVar23,auVar29,0);
    auVar24 = vpclmulqdq_vpclmulqdq(auVar23,auVar30,0x11);
    auVar23 = vpternlogd_avx512f(auVar24,auVar32,auVar25,0x96);
    if ((char)len < '\0') {
      auVar25 = vpclmulqdq_vpclmulqdq(auVar22,auVar29,0);
      auVar24 = vpclmulqdq_vpclmulqdq(auVar22,auVar30,0x11);
      auVar22 = vpternlogd_avx512f(auVar24,auVar25,*(undefined1 (*) [64])p,0x96);
      auVar25 = vpclmulqdq_vpclmulqdq(auVar23,auVar29,0);
      auVar24 = vpclmulqdq_vpclmulqdq(auVar23,auVar30,0x11);
      auVar23 = vpternlogd_avx512f(auVar24,auVar25,*(undefined1 (*) [64])((long)p + 0x40),0x96);
      goto LAB_0010af46;
    }
  }
  auVar24 = vpbroadcastq_avx512f(ZEXT816(0x8f352d95));
  auVar25 = vpbroadcastq_avx512f(ZEXT816(0x1d9513d7));
  auVar30 = vpclmulqdq_vpclmulqdq(auVar22,auVar24,0);
  auVar29 = vpclmulqdq_vpclmulqdq(auVar22,auVar25,0x11);
  auVar22 = vpternlogd_avx512f(auVar29,auVar30,auVar23,0x96);
  if ((len & 0x40) != 0) {
    auVar29 = vpclmulqdq_vpclmulqdq(auVar22,auVar24,0);
    auVar24 = vpclmulqdq_vpclmulqdq(auVar22,auVar25,0x11);
    auVar22 = vpternlogd_avx512f(auVar24,auVar29,*(undefined1 (*) [64])p,0x96);
  }
LAB_0010af91:
  vextracti64x4_avx512f(auVar22,1);
  halt_baddata();
}

Assistant:

static ATTRIBUTES u32
ADD_SUFFIX(crc32_x86)(u32 crc, const u8 *p, size_t len)
{
	/*
	 * mults_{N}v are the vectors of multipliers for folding across N vec_t
	 * vectors, i.e. N*VL*8 bits.  mults_128b are the two multipliers for
	 * folding across 128 bits.  mults_128b differs from mults_1v when
	 * VL != 16.  All multipliers are 64-bit, to match what pclmulqdq needs,
	 * but since this is for CRC-32 only their low 32 bits are nonzero.
	 * For more details, see scripts/gen-crc32-consts.py.
	 */
	const vec_t mults_8v = MULTS_8V;
	const vec_t mults_4v = MULTS_4V;
	const vec_t mults_2v = MULTS_2V;
	const vec_t mults_1v = MULTS_1V;
	const __m128i mults_128b = _mm_set_epi64x(CRC32_X95_MODG, CRC32_X159_MODG);
	const __m128i barrett_reduction_constants =
		_mm_set_epi64x(CRC32_BARRETT_CONSTANT_2, CRC32_BARRETT_CONSTANT_1);
	vec_t v0, v1, v2, v3, v4, v5, v6, v7;
	__m128i x0 = _mm_cvtsi32_si128(crc);
	__m128i x1;

	if (len < 8*VL) {
		if (len < VL) {
			STATIC_ASSERT(VL == 16 || VL == 32 || VL == 64);
			if (len < 16) {
			#if USE_AVX512
				if (len < 4)
					return crc32_slice1(crc, p, len);
				/*
				 * Handle 4 <= len <= 15 bytes by doing a masked
				 * load, XOR'ing the current CRC with the first
				 * 4 bytes, left-shifting by '16 - len' bytes to
				 * align the result to the end of x0 (so that it
				 * becomes the low-order coefficients of a
				 * 128-bit polynomial), and then doing the usual
				 * reduction from 128 bits to 32 bits.
				 */
				x0 = _mm_xor_si128(
					x0, _mm_maskz_loadu_epi8((1 << len) - 1, p));
				x0 = _mm_shuffle_epi8(
					x0, _mm_loadu_si128((const void *)&shift_tab[len]));
				goto reduce_x0;
			#else
				return crc32_slice1(crc, p, len);
			#endif
			}
			/*
			 * Handle 16 <= len < VL bytes where VL is 32 or 64.
			 * Use 128-bit instructions so that these lengths aren't
			 * slower with VL > 16 than with VL=16.
			 */
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			if (len >= 32) {
				x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 16)),
						 mults_128b);
				if (len >= 48)
					x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 32)),
							 mults_128b);
			}
			p += len & ~15;
			goto less_than_16_remaining;
		}
		v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		if (len < 2*VL) {
			p += VL;
			goto less_than_vl_remaining;
		}
		v1 = VLOADU(p + 1*VL);
		if (len < 4*VL) {
			p += 2*VL;
			goto less_than_2vl_remaining;
		}
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		p += 4*VL;
	} else {
		/*
		 * If the length is large and the pointer is misaligned, align
		 * it.  For smaller lengths, just take the misaligned load
		 * penalty.  Note that on recent x86 CPUs, vmovdqu with an
		 * aligned address is just as fast as vmovdqa, so there's no
		 * need to use vmovdqa in the main loop.
		 */
		if (len > 65536 && ((uintptr_t)p & (VL-1))) {
			size_t align = -(uintptr_t)p & (VL-1);

			len -= align;
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			p += 16;
			if (align & 15) {
				x0 = fold_lessthan16bytes(x0, p, align & 15,
							  mults_128b);
				p += align & 15;
				align &= ~15;
			}
			while (align) {
				x0 = fold_vec128(x0, *(const __m128i *)p,
						 mults_128b);
				p += 16;
				align -= 16;
			}
			v0 = M128I_TO_VEC(x0);
		#  if VL == 32
			v0 = _mm256_inserti128_si256(v0, *(const __m128i *)p, 1);
		#  elif VL == 64
			v0 = _mm512_inserti32x4(v0, *(const __m128i *)p, 1);
			v0 = _mm512_inserti64x4(v0, *(const __m256i *)(p + 16), 1);
		#  endif
			p -= 16;
		} else {
			v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		}
		v1 = VLOADU(p + 1*VL);
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		v4 = VLOADU(p + 4*VL);
		v5 = VLOADU(p + 5*VL);
		v6 = VLOADU(p + 6*VL);
		v7 = VLOADU(p + 7*VL);
		p += 8*VL;

		/*
		 * This is the main loop, processing 8*VL bytes per iteration.
		 * 4*VL is usually enough and would result in smaller code, but
		 * Skylake and Cascade Lake need 8*VL to get full performance.
		 */
		while (len >= 16*VL) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_8v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_8v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_8v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_8v);
			v4 = fold_vec(v4, VLOADU(p + 4*VL), mults_8v);
			v5 = fold_vec(v5, VLOADU(p + 5*VL), mults_8v);
			v6 = fold_vec(v6, VLOADU(p + 6*VL), mults_8v);
			v7 = fold_vec(v7, VLOADU(p + 7*VL), mults_8v);
			p += 8*VL;
			len -= 8*VL;
		}

		/* Fewer than 8*VL bytes remain. */
		v0 = fold_vec(v0, v4, mults_4v);
		v1 = fold_vec(v1, v5, mults_4v);
		v2 = fold_vec(v2, v6, mults_4v);
		v3 = fold_vec(v3, v7, mults_4v);
		if (len & (4*VL)) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_4v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_4v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_4v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_4v);
			p += 4*VL;
		}
	}
	/* Fewer than 4*VL bytes remain. */
	v0 = fold_vec(v0, v2, mults_2v);
	v1 = fold_vec(v1, v3, mults_2v);
	if (len & (2*VL)) {
		v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_2v);
		v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_2v);
		p += 2*VL;
	}
less_than_2vl_remaining:
	/* Fewer than 2*VL bytes remain. */
	v0 = fold_vec(v0, v1, mults_1v);
	if (len & VL) {
		v0 = fold_vec(v0, VLOADU(p), mults_1v);
		p += VL;
	}
less_than_vl_remaining:
	/*
	 * Fewer than VL bytes remain.  Reduce v0 (length VL bytes) to x0
	 * (length 16 bytes) and fold in any 16-byte data segments that remain.
	 */
#if VL == 16
	x0 = v0;
#else
	{
	#if VL == 32
		__m256i y0 = v0;
	#else
		const __m256i mults_256b =
			_mm256_set_epi64x(CRC32_X223_MODG, CRC32_X287_MODG,
					  CRC32_X223_MODG, CRC32_X287_MODG);
		__m256i y0 = fold_vec256(_mm512_extracti64x4_epi64(v0, 0),
					 _mm512_extracti64x4_epi64(v0, 1),
					 mults_256b);
		if (len & 32) {
			y0 = fold_vec256(y0, _mm256_loadu_si256((const void *)p),
					 mults_256b);
			p += 32;
		}
	#endif
		x0 = fold_vec128(_mm256_extracti128_si256(y0, 0),
				 _mm256_extracti128_si256(y0, 1), mults_128b);
	}
	if (len & 16) {
		x0 = fold_vec128(x0, _mm_loadu_si128((const void *)p),
				 mults_128b);
		p += 16;
	}
#endif
less_than_16_remaining:
	len &= 15;

	/* Handle any remainder of 1 to 15 bytes. */
	if (len)
		x0 = fold_lessthan16bytes(x0, p, len, mults_128b);
#if USE_AVX512
reduce_x0:
#endif
	/*
	 * Multiply the remaining 128-bit message polynomial 'x0' by x^32, then
	 * reduce it modulo the generator polynomial G.  This gives the CRC.
	 *
	 * This implementation matches that used in crc-pclmul-template.S from
	 * https://lore.kernel.org/r/20250210174540.161705-4-ebiggers@kernel.org/
	 * with the parameters n=32 and LSB_CRC=1 (what the gzip CRC uses).  See
	 * there for a detailed explanation of the math used here.
	 */
	x0 = _mm_xor_si128(_mm_clmulepi64_si128(x0, mults_128b, 0x10),
			   _mm_bsrli_si128(x0, 8));
	x1 = _mm_clmulepi64_si128(x0, barrett_reduction_constants, 0x00);
	x1 = _mm_clmulepi64_si128(x1, barrett_reduction_constants, 0x10);
	x0 = _mm_xor_si128(x0, x1);
	return _mm_extract_epi32(x0, 2);
}